

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int katherine_set_acq_time(katherine_device_t *device,double ns)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  char ack [8];
  undefined8 local_30;
  double local_28;
  
  local_28 = ns;
  iVar2 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar2 == 0) {
    uVar5 = (ulong)(local_28 / 10.0);
    local_30 = 0x1000000000000;
    if ((uVar5 & 0xffffffff) != 0) {
      puVar3 = &local_30;
      uVar4 = uVar5 & 0xffffffff;
      do {
        *(char *)puVar3 = (char)uVar4;
        puVar3 = (undefined8 *)((long)puVar3 + 1);
        bVar1 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar1);
    }
    iVar2 = katherine_udp_send_exact(&device->control_socket,&local_30,8);
    if (iVar2 == 0) {
      puVar3 = &local_30;
      iVar2 = katherine_udp_recv_exact(&device->control_socket,puVar3,8);
      if (iVar2 == 0) {
        local_30 = 0xa000000000000;
        if (uVar5 >> 0x20 != 0) {
          uVar5 = uVar5 >> 0x20;
          do {
            *(char *)puVar3 = (char)uVar5;
            puVar3 = (undefined8 *)((long)puVar3 + 1);
            bVar1 = 0xff < uVar5;
            uVar5 = uVar5 >> 8;
          } while (bVar1);
        }
        iVar2 = katherine_udp_send_exact(&device->control_socket,&local_30,8);
        if (iVar2 == 0) {
          iVar2 = katherine_udp_recv_exact(&device->control_socket,&local_30,8);
        }
      }
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar2;
}

Assistant:

int
katherine_set_acq_time(katherine_device_t *device, double ns)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    long acqt = (long) (ns / 10.);
    long lsb = (acqt & 0x00000000FFFFFFFF);
    long msb = (acqt & 0xFFFFFFFF00000000) >> 32;

    // Set LSB.
    res = katherine_cmd_set_acqtime_lsb(&device->control_socket, lsb);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    // Set MSB.
    res = katherine_cmd_set_acqtime_msb(&device->control_socket, msb);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}